

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

base_learner * Search::setup(options_i *options,vw *all)

{
  long *plVar1;
  char *pcVar2;
  double dVar3;
  byte bVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  pointer psVar8;
  typed_option<float> *filename;
  polylabel *ppVar9;
  ostream *poVar10;
  undefined8 uVar11;
  clock_t cVar12;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *this;
  long in_RSI;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *in_RDI;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  base_learner *base;
  stringstream __msg_4;
  search_metatask **mytask_3;
  stringstream __msg_3;
  search_task **mytask_2;
  search_metatask **mytask_1;
  search_task **mytask;
  uint32_t tmp_number_of_policies;
  stringstream __msg_2;
  stringstream __msg_1;
  stringstream __msg;
  option_group_definition new_options;
  string search_allowed_transitions;
  uint32_t search_trained_nb_policies;
  string rollin_string;
  string rollout_string;
  string neighbor_features_string;
  string interpolation_string;
  string metatask_string;
  string task_string;
  search_private *priv;
  free_ptr<search> sch;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffcaf8;
  vw *in_stack_ffffffffffffcb00;
  string *in_stack_ffffffffffffcb08;
  typed_option<float> *in_stack_ffffffffffffcb10;
  undefined4 in_stack_ffffffffffffcb18;
  undefined4 in_stack_ffffffffffffcb1c;
  uint uVar13;
  undefined8 in_stack_ffffffffffffcb20;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar14;
  string *in_stack_ffffffffffffcb28;
  allocator *paVar15;
  vw_exception *in_stack_ffffffffffffcb30;
  _func_void_search_ptr_size_t_ptr_options_i_ptr *p_Var16;
  unsigned_long in_stack_ffffffffffffcb38;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffcb48;
  undefined7 in_stack_ffffffffffffcb50;
  undefined1 in_stack_ffffffffffffcb57;
  search *in_stack_ffffffffffffcb98;
  vw *in_stack_ffffffffffffcba0;
  search *in_stack_ffffffffffffcbe8;
  undefined6 in_stack_ffffffffffffcbf0;
  undefined1 in_stack_ffffffffffffcbf6;
  byte bVar17;
  undefined1 in_stack_ffffffffffffcbf7;
  float local_3310;
  float local_3308;
  bool local_32c2;
  action A;
  allocator local_2ff1;
  string local_2ff0 [32];
  base_learner *local_2fd0;
  undefined1 local_2fc1;
  stringstream local_2fa0 [16];
  ostream local_2f90;
  allocator local_2e11;
  string local_2e10 [39];
  allocator local_2de9;
  string local_2de8 [32];
  string local_2dc8 [16];
  auto_condition_settings *in_stack_ffffffffffffd248;
  vw *in_stack_ffffffffffffd250;
  allocator local_2da1;
  string local_2da0 [37];
  byte local_2d7b;
  byte local_2d7a;
  allocator local_2d79;
  string local_2d78 [37];
  byte local_2d53;
  byte local_2d52;
  allocator local_2d51;
  string local_2d50 [37];
  byte local_2d2b;
  byte local_2d2a;
  allocator local_2d29;
  string local_2d28 [37];
  byte local_2d03;
  byte local_2d02;
  allocator local_2d01;
  string local_2d00 [39];
  allocator local_2cd9;
  string local_2cd8 [32];
  undefined **local_2cb8;
  undefined1 local_2ca9;
  stringstream local_2c88 [16];
  ostream local_2c78;
  allocator local_2af9;
  string local_2af8 [32];
  undefined **local_2ad8;
  undefined **local_2ad0;
  undefined **local_2ac8;
  allocator local_2ab9;
  string local_2ab8 [32];
  string local_2a98 [39];
  allocator local_2a71;
  string local_2a70 [39];
  allocator local_2a49;
  string local_2a48 [32];
  string local_2a28 [39];
  allocator local_2a01;
  string local_2a00 [36];
  uint32_t local_29dc;
  label_t local_29d8;
  wclass *local_29d0;
  wclass *local_29c8;
  size_t local_29c0;
  label_t local_29b8;
  wclass *pwStack_29b0;
  wclass *local_29a8;
  size_t sStack_29a0;
  label_t local_2998;
  wclass *local_2990;
  wclass *local_2988;
  size_t local_2980;
  label_t local_2978;
  wclass *pwStack_2970;
  wclass *local_2968;
  size_t sStack_2960;
  allocator local_2951;
  string local_2950 [39];
  undefined1 local_2929;
  stringstream local_2908 [16];
  ostream local_28f8;
  undefined1 local_2779;
  stringstream local_2758 [16];
  ostream local_2748;
  undefined1 local_25c9;
  stringstream local_25a8 [16];
  ostream local_2598;
  undefined4 local_2420;
  allocator local_2419;
  string local_2418 [39];
  allocator local_23f1;
  string local_23f0 [39];
  allocator local_23c9;
  string local_23c8 [359];
  allocator local_2261;
  string local_2260 [39];
  allocator local_2239;
  string local_2238 [359];
  allocator local_20d1;
  string local_20d0 [39];
  allocator local_20a9;
  string local_20a8 [359];
  allocator local_1f41;
  string local_1f40 [39];
  allocator local_1f19;
  string local_1f18 [359];
  allocator local_1db1;
  string local_1db0 [39];
  allocator local_1d89;
  string local_1d88 [359];
  allocator local_1c21;
  string local_1c20 [39];
  allocator local_1bf9;
  string local_1bf8 [359];
  allocator local_1a91;
  string local_1a90 [39];
  allocator local_1a69;
  string local_1a68 [32];
  typed_option<unsigned_long> local_1a48 [2];
  allocator local_1901;
  string local_1900 [39];
  allocator local_18d9;
  string local_18d8 [359];
  allocator local_1771;
  string local_1770 [39];
  allocator local_1749;
  string local_1748 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1728 [2];
  allocator local_15e1;
  string local_15e0 [39];
  allocator local_15b9;
  string local_15b8 [359];
  allocator local_1451;
  string local_1450 [39];
  allocator local_1429;
  string local_1428 [359];
  allocator local_12c1;
  string local_12c0 [39];
  allocator local_1299;
  string local_1298 [359];
  allocator local_1131;
  string local_1130 [39];
  allocator local_1109;
  string local_1108 [359];
  allocator local_fa1;
  string local_fa0 [39];
  allocator local_f79;
  string local_f78 [359];
  allocator local_e11;
  string local_e10 [39];
  allocator local_de9;
  string local_de8 [359];
  allocator local_c81;
  string local_c80 [39];
  allocator local_c59;
  string local_c58 [359];
  allocator local_af1;
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [359];
  allocator local_961;
  string local_960 [39];
  allocator local_939;
  string local_938 [359];
  allocator local_7d1;
  string local_7d0 [39];
  allocator local_7a9;
  string local_7a8 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_788 [2];
  allocator local_641;
  string local_640 [39];
  allocator local_619;
  string local_618 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f8 [2];
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_468 [2];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  typed_option<unsigned_long> local_2d8 [2];
  allocator local_191;
  string local_190 [32];
  undefined1 local_170 [56];
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [55];
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  search_private *local_30;
  undefined1 local_28 [16];
  long local_18;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<Search::search>();
  psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::operator->
                     ((unique_ptr<Search::search,_void_(*)(void_*)> *)0x3a36b9);
  local_30 = psVar8->priv;
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"data",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::string(local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"mix_per_state",&local_e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"mix_per_state",&local_111);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::string(local_138);
  local_30->A = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"Search options",&local_191);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffcb00,
             (string *)in_stack_ffffffffffffcaf8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"search",&local_2f9);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffcb08,(unsigned_long *)in_stack_ffffffffffffcb00);
  VW::config::typed_option<unsigned_long>::keep(local_2d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_320,"Use learning to search, argument=maximum action id or 0 for LDF",&local_321)
  ;
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<unsigned_long>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"search_task",&local_489);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffcb08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffcb00);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_468,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4b0,
             "the search task (use \"--search_task list\" to get a list of available tasks)",
             &local_4b1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffcb00,in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),in_stack_ffffffffffffcb48
            );
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"search_metatask",&local_619);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffcb08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffcb00);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_5f8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_640,
             "the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"
             ,&local_641);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffcb00,in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),in_stack_ffffffffffffcb48
            );
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a8,"search_interpolation",&local_7a9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffcb08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffcb00);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_788,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7d0,"at what level should interpolation happen? [*data|policy]",&local_7d1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffcb00,in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),in_stack_ffffffffffffcb48
            );
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_938,"search_rollout",&local_939);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffcb08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffcb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_960,
             "how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"
             ,&local_961);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffcb00,in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),in_stack_ffffffffffffcb48
            );
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_960);
  std::allocator<char>::~allocator((allocator<char> *)&local_961);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,"search_rollin",&local_ac9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffcb08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffcb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_af0,
             "how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"
             ,&local_af1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffcb00,in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),in_stack_ffffffffffffcb48
            );
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c58,"search_passes_per_policy",&local_c59);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffcb08,(unsigned_long *)in_stack_ffffffffffffcb00);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb10,
             (unsigned_long)in_stack_ffffffffffffcb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c80,"number of passes per policy (only valid for search_interpolation=policy)",
             &local_c81);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<unsigned_long>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_c80);
  std::allocator<char>::~allocator((allocator<char> *)&local_c81);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_c58);
  std::allocator<char>::~allocator((allocator<char> *)&local_c59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_de8,"search_beta",&local_de9);
  VW::config::make_option<float>(in_stack_ffffffffffffcb08,(float *)in_stack_ffffffffffffcb00);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffcb10,(float)((ulong)in_stack_ffffffffffffcb08 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e10,
             "interpolation rate for policies (only valid for search_interpolation=policy)",
             &local_e11);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffcb00,
             (typed_option<float> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<float>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<float> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_e10);
  std::allocator<char>::~allocator((allocator<char> *)&local_e11);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_de8);
  std::allocator<char>::~allocator((allocator<char> *)&local_de9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f78,"search_alpha",&local_f79);
  VW::config::make_option<float>(in_stack_ffffffffffffcb08,(float *)in_stack_ffffffffffffcb00);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffcb10,(float)((ulong)in_stack_ffffffffffffcb08 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_fa0,"annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)",
             &local_fa1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffcb00,
             (typed_option<float> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<float>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<float> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_fa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_f78);
  std::allocator<char>::~allocator((allocator<char> *)&local_f79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1108,"search_total_nb_policies",&local_1109);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffcb08,(uint *)in_stack_ffffffffffffcb00)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1130,
             "if we are going to train the policies through multiple separate calls to vw, we need to specify this parameter and tell vw how many policies are eventually going to be trained"
             ,&local_1131);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb00,
             (string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb00,
             (typed_option<unsigned_int> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<unsigned_int>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1130);
  std::allocator<char>::~allocator((allocator<char> *)&local_1131);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1108);
  std::allocator<char>::~allocator((allocator<char> *)&local_1109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1298,"search_trained_nb_policies",&local_1299);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffcb08,(uint *)in_stack_ffffffffffffcb00)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12c0,"the number of trained policies in a file",&local_12c1);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb00,
             (string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb00,
             (typed_option<unsigned_int> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<unsigned_int>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_12c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12c1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1298);
  std::allocator<char>::~allocator((allocator<char> *)&local_1299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1428,"search_allowed_transitions",&local_1429);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffcb08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffcb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1450,"read file of allowed transitions [def: all transitions are allowed]",
             &local_1451);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffcb00,in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),in_stack_ffffffffffffcb48
            );
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1450);
  std::allocator<char>::~allocator((allocator<char> *)&local_1451);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1428);
  std::allocator<char>::~allocator((allocator<char> *)&local_1429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15b8,"search_subsample_time",&local_15b9);
  VW::config::make_option<float>(in_stack_ffffffffffffcb08,(float *)in_stack_ffffffffffffcb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_15e0,
             "instead of training at all timesteps, use a subset. if value in (0,1), train on a random v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"
             ,&local_15e1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffcb00,
             (typed_option<float> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<float>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<float> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_15e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15e1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_15b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1748,"search_neighbor_features",&local_1749);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffcb08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffcb00);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_1728,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1770,
             "copy features from neighboring lines. argument looks like: \'-1:a,+2\' meaning copy previous line namespace a and next next line from namespace _unnamed_, where \',\' separates them"
             ,&local_1771);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffcb00,in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),in_stack_ffffffffffffcb48
            );
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1770);
  std::allocator<char>::~allocator((allocator<char> *)&local_1771);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1748);
  std::allocator<char>::~allocator((allocator<char> *)&local_1749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18d8,"search_rollout_num_steps",&local_18d9);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffcb08,(unsigned_long *)in_stack_ffffffffffffcb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1900,
             "how many calls of \"loss\" before we stop really predicting on rollouts and switch to oracle (default means \"infinite\")"
             ,&local_1901);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<unsigned_long>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1900);
  std::allocator<char>::~allocator((allocator<char> *)&local_1901);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_18d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a68,"search_history_length",&local_1a69);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffcb08,(unsigned_long *)in_stack_ffffffffffffcb00);
  VW::config::typed_option<unsigned_long>::keep(local_1a48,true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb10,
             (unsigned_long)in_stack_ffffffffffffcb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a90,
             "some tasks allow you to specify how much history their depend on; specify that here",
             &local_1a91);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<unsigned_long>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a91);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1bf8,"search_no_caching",&local_1bf9);
  VW::config::make_option<bool>(in_stack_ffffffffffffcb08,(bool *)in_stack_ffffffffffffcb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c20,
             "turn off the built-in caching ability (makes things slower, but technically more safe)"
             ,&local_1c21);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffcb00,
             (typed_option<bool> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<bool> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c21);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d88,"search_xv",&local_1d89);
  VW::config::make_option<bool>(in_stack_ffffffffffffcb08,(bool *)in_stack_ffffffffffffcb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1db0,"train two separate policies, alternating prediction/learning",&local_1db1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffcb00,
             (typed_option<bool> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<bool> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1db0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1db1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1d88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f18,"search_perturb_oracle",&local_1f19);
  VW::config::make_option<float>(in_stack_ffffffffffffcb08,(float *)in_stack_ffffffffffffcb00);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffcb10,(float)((ulong)in_stack_ffffffffffffcb08 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f40,"perturb the oracle on rollin with this probability",&local_1f41);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffcb00,
             (typed_option<float> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<float>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<float> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1f40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f41);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_1f18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20a8,"search_linear_ordering",&local_20a9);
  VW::config::make_option<bool>(in_stack_ffffffffffffcb08,(bool *)in_stack_ffffffffffffcb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_20d0,"insist on generating examples in linear order (def: hoopla permutation)",
             &local_20d1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffcb00,(string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffcb00,
             (typed_option<bool> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<bool> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_20d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_20d1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_20a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_20a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2238,"search_active_verify",&local_2239);
  VW::config::make_option<float>(in_stack_ffffffffffffcb08,(float *)in_stack_ffffffffffffcb00);
  paVar15 = &local_2261;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2260,
             "verify that active learning is doing the right thing (arg = multiplier, should be = cost_range * range_c)"
             ,paVar15);
  filename = VW::config::typed_option<float>::help
                       ((typed_option<float> *)in_stack_ffffffffffffcb00,
                        (string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffcb00,
             (typed_option<float> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<float>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<float> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_2260);
  std::allocator<char>::~allocator((allocator<char> *)&local_2261);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_2238);
  std::allocator<char>::~allocator((allocator<char> *)&local_2239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_23c8,"search_save_every_k_runs",&local_23c9);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffcb08,(unsigned_long *)in_stack_ffffffffffffcb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_23f0,"save model every k runs",&local_23f1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (string *)in_stack_ffffffffffffcaf8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcaf8);
  VW::config::option_group_definition::add<unsigned_long>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffcb57,in_stack_ffffffffffffcb50),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffcb48);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_23f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_23f1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_23c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_23c9);
  (*(code *)**(undefined8 **)local_10)(local_10,local_170);
  plVar14 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2418,"search_task",&local_2419);
  bVar4 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2418);
  local_32c2 = true;
  if ((bVar4 & 1) != 0) {
    local_32c2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffcb00,(char *)in_stack_ffffffffffffcaf8);
  }
  std::__cxx11::string::~string(local_2418);
  std::allocator<char>::~allocator((allocator<char> *)&local_2419);
  if (local_32c2 == false) {
    std::unique_ptr<Search::search,_void_(*)(void_*)>::get
              ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffcb00);
    search_initialize(in_stack_ffffffffffffcba0,in_stack_ffffffffffffcb98);
    std::unique_ptr<Search::search,_void_(*)(void_*)>::get
              ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffcb00);
    parse_neighbor_features
              ((string *)
               CONCAT17(in_stack_ffffffffffffcbf7,
                        CONCAT16(in_stack_ffffffffffffcbf6,in_stack_ffffffffffffcbf0)),
               in_stack_ffffffffffffcbe8);
    iVar6 = std::__cxx11::string::compare((char *)local_90);
    if (iVar6 == 0) {
      local_30->adaptive_beta = true;
      local_30->allow_current_policy = true;
      local_30->passes_per_policy = *(size_t *)(local_18 + 0x348);
      if (1 < local_30->current_policy) {
        local_30->current_policy = 1;
      }
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)local_90);
      iVar7 = (int)((ulong)in_stack_ffffffffffffcb20 >> 0x20);
      if (iVar6 != 0) {
        std::__cxx11::stringstream::stringstream(local_25a8);
        std::operator<<(&local_2598,"error: --search_interpolation must be \'data\' or \'policy\'");
        local_25c9 = 1;
        uVar11 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_ffffffffffffcb30,(char *)in_stack_ffffffffffffcb28,iVar7,
                   (string *)CONCAT44(in_stack_ffffffffffffcb1c,in_stack_ffffffffffffcb18));
        local_25c9 = 0;
        __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    iVar6 = std::__cxx11::string::compare((char *)local_e8);
    if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_e8), iVar6 == 0)) {
      local_30->rollout_method = POLICY;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)local_e8);
      if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_e8), iVar6 == 0)) {
        local_30->rollout_method = ORACLE;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar6 == 0) {
          local_30->rollout_method = MIX_PER_STATE;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)local_e8);
          if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_e8), iVar6 == 0))
          {
            local_30->rollout_method = MIX_PER_ROLL;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)local_e8);
            iVar7 = (int)((ulong)in_stack_ffffffffffffcb20 >> 0x20);
            if (iVar6 != 0) {
              std::__cxx11::stringstream::stringstream(local_2758);
              std::operator<<(&local_2748,
                              "error: --search_rollout must be \'learn\', \'ref\', \'mix\', \'mix_per_state\' or \'none\'"
                             );
              local_2779 = 1;
              uVar11 = __cxa_allocate_exception(0x38);
              std::__cxx11::stringstream::str();
              VW::vw_exception::vw_exception
                        (in_stack_ffffffffffffcb30,(char *)in_stack_ffffffffffffcb28,iVar7,
                         (string *)CONCAT44(in_stack_ffffffffffffcb1c,in_stack_ffffffffffffcb18));
              local_2779 = 0;
              __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
            }
            local_30->rollout_method = NO_ROLLOUT;
            local_30->no_caching = true;
          }
        }
      }
    }
    iVar6 = std::__cxx11::string::compare((char *)local_110);
    if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_110), iVar6 == 0)) {
      local_30->rollin_method = POLICY;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)local_110);
      if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_110), iVar6 == 0)) {
        local_30->rollin_method = ORACLE;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)local_110);
        if (iVar6 == 0) {
          local_30->rollin_method = MIX_PER_STATE;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)local_110);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare((char *)local_110);
            iVar7 = (int)((ulong)in_stack_ffffffffffffcb20 >> 0x20);
            if (iVar6 != 0) {
              std::__cxx11::stringstream::stringstream(local_2908);
              std::operator<<(&local_28f8,
                              "error: --search_rollin must be \'learn\', \'ref\', \'mix\' or \'mix_per_state\'"
                             );
              local_2929 = 1;
              uVar11 = __cxa_allocate_exception(0x38);
              std::__cxx11::stringstream::str();
              VW::vw_exception::vw_exception
                        (in_stack_ffffffffffffcb30,(char *)in_stack_ffffffffffffcb28,iVar7,
                         (string *)CONCAT44(in_stack_ffffffffffffcb1c,in_stack_ffffffffffffcb18));
              local_2929 = 0;
              __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
            }
          }
          local_30->rollin_method = MIX_PER_ROLL;
        }
      }
    }
    ppVar9 = calloc_or_throw<polylabel>();
    plVar14 = local_10;
    local_30->allowed_actions_cache = ppVar9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2950,"cb",&local_2951);
    bVar4 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2950);
    std::__cxx11::string::~string(local_2950);
    std::allocator<char>::~allocator((allocator<char> *)&local_2951);
    if ((bVar4 & 1) == 0) {
      local_30->cb_learner = false;
      (*(code *)COST_SENSITIVE::cs_label)(local_30->allowed_actions_cache);
      v_init<COST_SENSITIVE::wclass>();
      (local_30->learn_losses).cs.costs.end_array = local_29a8;
      (local_30->learn_losses).cs.costs.erase_count = sStack_29a0;
      (local_30->learn_losses).multi = local_29b8;
      (local_30->learn_losses).cs.costs._end = pwStack_29b0;
      v_init<COST_SENSITIVE::wclass>();
      (local_30->gte_label).multi = local_29d8;
      (local_30->gte_label).cs.costs._end = local_29d0;
      (local_30->gte_label).cs.costs.end_array = local_29c8;
      (local_30->gte_label).cs.costs.erase_count = local_29c0;
    }
    else {
      local_30->cb_learner = true;
      (*(code *)CB::cb_label)(local_30->allowed_actions_cache);
      v_init<CB::cb_class>();
      (local_30->learn_losses).cs.costs.end_array = local_2968;
      (local_30->learn_losses).cs.costs.erase_count = sStack_2960;
      (local_30->learn_losses).multi = local_2978;
      (local_30->learn_losses).cs.costs._end = pwStack_2970;
      v_init<CB::cb_class>();
      (local_30->gte_label).multi = local_2998;
      (local_30->gte_label).cs.costs._end = local_2990;
      (local_30->gte_label).cs.costs.end_array = local_2988;
      (local_30->gte_label).cs.costs.erase_count = local_2980;
    }
    ensure_param((float *)in_stack_ffffffffffffcb10,
                 (float)((ulong)in_stack_ffffffffffffcb08 >> 0x20),
                 SUB84(in_stack_ffffffffffffcb08,0),
                 (float)((ulong)in_stack_ffffffffffffcb00 >> 0x20),(char *)in_stack_ffffffffffffcaf8
                );
    ensure_param((float *)in_stack_ffffffffffffcb10,
                 (float)((ulong)in_stack_ffffffffffffcb08 >> 0x20),
                 SUB84(in_stack_ffffffffffffcb08,0),
                 (float)((ulong)in_stack_ffffffffffffcb00 >> 0x20),(char *)in_stack_ffffffffffffcaf8
                );
    local_30->num_calls_to_run = 0;
    local_29dc = local_30->current_policy;
    if ((*(byte *)(local_18 + 0x343a) & 1) != 0) {
      local_3308 = (float)*(ulong *)(local_18 + 0x348);
      local_3310 = (float)local_30->passes_per_policy;
      dVar3 = std::ceil((double)(ulong)(uint)(local_3308 / local_3310));
      local_29dc = (int)SUB84(dVar3,0) + local_29dc;
    }
    if ((local_30->total_number_of_policies < local_29dc) &&
       (local_30->total_number_of_policies = local_29dc, local_30->current_policy != 0)) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                "warning: you\'re attempting to train more classifiers than was allocated initially. Likely to cause bad performance."
                               );
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    if (((*(byte *)(local_18 + 0x343a) & 1) == 0) && (local_30->current_policy != 0)) {
      local_30->current_policy = local_30->current_policy - 1;
    }
    plVar1 = *(long **)(local_18 + 0x278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a00,"search_trained_nb_policies",&local_2a01);
    std::__cxx11::to_string((uint)((ulong)in_stack_ffffffffffffcb28 >> 0x20));
    (**(code **)(*plVar1 + 0x30))(plVar1,local_2a00,local_2a28);
    std::__cxx11::string::~string(local_2a28);
    std::__cxx11::string::~string(local_2a00);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a48,"search_trained_nb_policies",&local_2a49);
    VW::config::options_i::get_typed_option<unsigned_int>
              ((options_i *)in_stack_ffffffffffffcb30,in_stack_ffffffffffffcb28);
    VW::config::typed_option<unsigned_int>::value
              ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb10,
               (uint)((ulong)in_stack_ffffffffffffcb08 >> 0x20));
    std::__cxx11::string::~string(local_2a48);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a49);
    plVar1 = *(long **)(local_18 + 0x278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a70,"search_total_nb_policies",&local_2a71);
    std::__cxx11::to_string((uint)((ulong)in_stack_ffffffffffffcb28 >> 0x20));
    (**(code **)(*plVar1 + 0x30))(plVar1,local_2a70,local_2a98);
    std::__cxx11::string::~string(local_2a98);
    std::__cxx11::string::~string(local_2a70);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2ab8,"search_total_nb_policies",&local_2ab9);
    VW::config::options_i::get_typed_option<unsigned_int>
              ((options_i *)in_stack_ffffffffffffcb30,in_stack_ffffffffffffcb28);
    VW::config::typed_option<unsigned_int>::value
              ((typed_option<unsigned_int> *)in_stack_ffffffffffffcb10,
               (uint)((ulong)in_stack_ffffffffffffcb08 >> 0x20));
    std::__cxx11::string::~string(local_2ab8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2ab9);
    iVar6 = std::__cxx11::string::compare((char *)local_50);
    if (iVar6 == 0) {
      poVar10 = (ostream *)
                std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<(poVar10,"available search tasks:");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      for (local_2ac8 = &all_tasks; *local_2ac8 != (undefined *)0x0; local_2ac8 = local_2ac8 + 1) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"  ");
        poVar10 = std::operator<<(poVar10,*(char **)*local_2ac8);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    iVar6 = std::__cxx11::string::compare((char *)local_70);
    if (iVar6 == 0) {
      poVar10 = (ostream *)
                std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<(poVar10,"available search metatasks:");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      for (local_2ad0 = &all_metatasks; *local_2ad0 != (undefined *)0x0; local_2ad0 = local_2ad0 + 1
          ) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"  ");
        poVar10 = std::operator<<(poVar10,*(char **)*local_2ad0);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    for (local_2ad8 = &all_tasks; *local_2ad8 != (undefined *)0x0; local_2ad8 = local_2ad8 + 1) {
      iVar6 = std::__cxx11::string::compare((char *)local_50);
      if (iVar6 == 0) {
        local_30->task = (search_task *)*local_2ad8;
        pcVar2 = *(char **)*local_2ad8;
        psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::operator->
                           ((unique_ptr<Search::search,_void_(*)(void_*)> *)0x3a7859);
        psVar8->task_name = pcVar2;
        break;
      }
    }
    plVar14 = local_10;
    if (local_30->task == (search_task *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2af8,"help",&local_2af9);
      bVar4 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2af8);
      std::__cxx11::string::~string(local_2af8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2af9);
      iVar6 = (int)((ulong)in_stack_ffffffffffffcb20 >> 0x20);
      if (((bVar4 ^ 0xff) & 1) != 0) {
        std::__cxx11::stringstream::stringstream(local_2c88);
        poVar10 = std::operator<<(&local_2c78,"fail: unknown task for --search_task \'");
        poVar10 = std::operator<<(poVar10,local_50);
        std::operator<<(poVar10,"\'; use --search_task list to get a list");
        local_2ca9 = 1;
        uVar11 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_ffffffffffffcb30,(char *)in_stack_ffffffffffffcb28,iVar6,
                   (string *)CONCAT44(in_stack_ffffffffffffcb1c,in_stack_ffffffffffffcb18));
        local_2ca9 = 0;
        __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    local_30->metatask = (search_metatask *)0x0;
    local_2cb8 = &all_metatasks;
    while( true ) {
      A = (action)((ulong)paVar15 >> 0x20);
      iVar6 = (int)((ulong)in_stack_ffffffffffffcb20 >> 0x20);
      if (*local_2cb8 == (undefined *)0x0) break;
      iVar7 = std::__cxx11::string::compare((char *)local_70);
      A = (action)((ulong)paVar15 >> 0x20);
      iVar6 = (int)((ulong)in_stack_ffffffffffffcb20 >> 0x20);
      if (iVar7 == 0) {
        local_30->metatask = (search_metatask *)*local_2cb8;
        pcVar2 = *(char **)*local_2cb8;
        psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::operator->
                           ((unique_ptr<Search::search,_void_(*)(void_*)> *)0x3a7b6b);
        psVar8->metatask_name = pcVar2;
        break;
      }
      local_2cb8 = local_2cb8 + 1;
    }
    plVar14 = local_10;
    *(undefined1 *)(*(long *)(local_18 + 8) + 0x234) = 1;
    std::allocator<char>::allocator();
    local_2d02 = 0;
    local_2d03 = 0;
    local_2d2a = 0;
    local_2d2b = 0;
    local_2d52 = 0;
    local_2d53 = 0;
    local_2d7a = 0;
    local_2d7b = 0;
    std::__cxx11::string::string(local_2cd8,"csoaa",&local_2cd9);
    bVar4 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2cd8);
    plVar14 = local_10;
    bVar17 = 0;
    if ((bVar4 & 1) == 0) {
      paVar15 = &local_2d01;
      std::allocator<char>::allocator();
      local_2d02 = 1;
      std::__cxx11::string::string(local_2d00,"cs_active",paVar15);
      local_2d03 = 1;
      bVar4 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2d00);
      plVar14 = local_10;
      bVar17 = 0;
      if ((bVar4 & 1) == 0) {
        std::allocator<char>::allocator();
        local_2d2a = 1;
        std::__cxx11::string::string(local_2d28,"csoaa_ldf",&local_2d29);
        local_2d2b = 1;
        bVar4 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2d28);
        plVar14 = local_10;
        bVar17 = 0;
        if ((bVar4 & 1) == 0) {
          std::allocator<char>::allocator();
          local_2d52 = 1;
          std::__cxx11::string::string(local_2d50,"wap_ldf",&local_2d51);
          local_2d53 = 1;
          bVar4 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2d50);
          bVar17 = 0;
          if ((bVar4 & 1) == 0) {
            paVar15 = &local_2d79;
            plVar14 = local_10;
            std::allocator<char>::allocator();
            local_2d7a = 1;
            std::__cxx11::string::string(local_2d78,"cb",paVar15);
            local_2d7b = 1;
            bVar17 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2d78);
            bVar17 = bVar17 ^ 0xff;
          }
        }
      }
    }
    if ((local_2d7b & 1) != 0) {
      std::__cxx11::string::~string(local_2d78);
    }
    if ((local_2d7a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_2d79);
    }
    if ((local_2d53 & 1) != 0) {
      std::__cxx11::string::~string(local_2d50);
    }
    if ((local_2d52 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_2d51);
    }
    if ((local_2d2b & 1) != 0) {
      std::__cxx11::string::~string(local_2d28);
    }
    if ((local_2d2a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_2d29);
    }
    if ((local_2d03 & 1) != 0) {
      std::__cxx11::string::~string(local_2d00);
    }
    if ((local_2d02 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_2d01);
    }
    std::__cxx11::string::~string(local_2cd8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2cd9);
    plVar14 = local_10;
    if ((bVar17 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2da0,"csoaa",&local_2da1);
      std::__cxx11::to_string(in_stack_ffffffffffffcb38);
      (**(code **)(*(long *)plVar14 + 0x28))(plVar14,local_2da0,local_2dc8);
      std::__cxx11::string::~string(local_2dc8);
      std::__cxx11::string::~string(local_2da0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2da1);
    }
    plVar14 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2de8,"cs_active",&local_2de9);
    bVar4 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2de8);
    local_30->active_csoaa = (bool)(bVar4 & 1);
    std::__cxx11::string::~string(local_2de8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2de9);
    plVar14 = local_10;
    local_30->active_csoaa_verify = -1.0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e10,"search_active_verify",&local_2e11);
    bVar4 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_2e10);
    std::__cxx11::string::~string(local_2e10);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e11);
    if (((bVar4 & 1) != 0) && ((local_30->active_csoaa & 1U) == 0)) {
      std::__cxx11::stringstream::stringstream(local_2fa0);
      std::operator<<(&local_2f90,"cannot use --search_active_verify without using --cs_active");
      local_2fc1 = 1;
      uVar11 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffcb30,(char *)in_stack_ffffffffffffcb28,iVar6,
                 (string *)CONCAT44(in_stack_ffffffffffffcb1c,in_stack_ffffffffffffcb18));
      local_2fc1 = 0;
      __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_2fd0 = setup_base((options_i *)in_stack_ffffffffffffcb08,in_stack_ffffffffffffcb00);
    memcpy((void *)(*(long *)(local_18 + 8) + 0x330),MULTICLASS::mc_label,0x48);
    *(undefined4 *)(local_18 + 0x3650) = 5;
    if ((local_30->task != (search_task *)0x0) &&
       (local_30->task->initialize != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
      p_Var16 = local_30->task->initialize;
      psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::get
                         ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffcb00)
      ;
      (*p_Var16)(psVar8,&local_30->A,(options_i *)local_10);
    }
    if ((local_30->metatask != (search_metatask *)0x0) &&
       (local_30->metatask->initialize != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
      p_Var16 = local_30->metatask->initialize;
      psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::get
                         ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffcb00)
      ;
      (*p_Var16)(psVar8,&local_30->A,(options_i *)local_10);
    }
    local_30->meta_t = 0;
    paVar15 = &local_2ff1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2ff0,"search_allowed_transitions",paVar15);
    uVar5 = (**(code **)(*(long *)local_10 + 8))(local_10,local_2ff0);
    uVar13 = CONCAT13(uVar5,(int3)in_stack_ffffffffffffcb1c);
    std::__cxx11::string::~string(local_2ff0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2ff1);
    plVar14 = local_10;
    if ((uVar13 & 0x1000000) != 0) {
      in_stack_ffffffffffffcb18 = (undefined4)local_30->A;
      std::__cxx11::string::c_str();
      read_allowed_transitions(A,(char *)filename);
      plVar14 = local_10;
    }
    handle_condition_options(in_stack_ffffffffffffd250,in_stack_ffffffffffffd248);
    if ((local_30->allow_current_policy & 1U) == 0) {
      *(size_t *)(local_18 + 0x3468) = local_30->passes_per_policy;
    }
    *(undefined1 **)(local_18 + 0x280) = local_28;
    cVar12 = clock();
    local_30->start_clock_time = cVar12;
    if ((local_30->xv & 1U) != 0) {
      local_30->num_learners = local_30->num_learners * 3;
    }
    in_stack_ffffffffffffcb10 = (typed_option<float> *)LEARNER::make_base<char,char>(local_2fd0);
    this = LEARNER::
           init_learner<Search::search,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,char>>
                     ((free_ptr<Search::search> *)plVar14,
                      (learner<char,_char> *)CONCAT44(uVar13,in_stack_ffffffffffffcb18),
                      (_func_void_search_ptr_learner<char,_char>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                       *)in_stack_ffffffffffffcb10,
                      (_func_void_search_ptr_learner<char,_char>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                       *)in_stack_ffffffffffffcb08,(size_t)in_stack_ffffffffffffcb00);
    LEARNER::learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish_example(this,finish_multiline_example);
    LEARNER::learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_end_examples(plVar14,(_func_void_search_ptr *)CONCAT44(uVar13,in_stack_ffffffffffffcb18));
    LEARNER::learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish(plVar14,(_func_void_search_ptr *)CONCAT44(uVar13,in_stack_ffffffffffffcb18));
    LEARNER::learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_end_pass(plVar14,(_func_void_search_ptr *)CONCAT44(uVar13,in_stack_ffffffffffffcb18));
    in_stack_ffffffffffffcb00 =
         (vw *)LEARNER::make_base<Search::search,std::vector<example*,std::allocator<example*>>>
                         (this);
    local_8 = in_stack_ffffffffffffcb00;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_2420 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffcb00);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::unique_ptr<Search::search,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffcb10);
  return (base_learner *)local_8;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  free_ptr<search> sch = scoped_calloc_or_throw<search>();
  search_private& priv = *sch->priv;
  std::string task_string;
  std::string metatask_string;
  std::string interpolation_string = "data";
  std::string neighbor_features_string;
  std::string rollout_string = "mix_per_state";
  std::string rollin_string = "mix_per_state";

  uint32_t search_trained_nb_policies;
  std::string search_allowed_transitions;

  priv.A = 1;
  option_group_definition new_options("Search options");
  new_options.add(
      make_option("search", priv.A).keep().help("Use learning to search, argument=maximum action id or 0 for LDF"));
  new_options.add(make_option("search_task", task_string)
                      .keep()
                      .help("the search task (use \"--search_task list\" to get a list of available tasks)"));
  new_options.add(
      make_option("search_metatask", metatask_string)
          .keep()
          .help("the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"));
  new_options.add(make_option("search_interpolation", interpolation_string)
                      .keep()
                      .help("at what level should interpolation happen? [*data|policy]"));
  new_options.add(
      make_option("search_rollout", rollout_string)
          .help("how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"));
  new_options.add(make_option("search_rollin", rollin_string)
                      .help("how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"));
  new_options.add(make_option("search_passes_per_policy", priv.passes_per_policy)
                      .default_value(1)
                      .help("number of passes per policy (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_beta", priv.beta)
                      .default_value(0.5f)
                      .help("interpolation rate for policies (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_alpha", priv.alpha)
                      .default_value(1e-10f)
                      .help("annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)"));
  new_options.add(make_option("search_total_nb_policies", priv.total_number_of_policies)
                      .help("if we are going to train the policies through multiple separate calls to vw, we need to "
                            "specify this parameter and tell vw how many policies are eventually going to be trained"));
  new_options.add(make_option("search_trained_nb_policies", search_trained_nb_policies)
                      .help("the number of trained policies in a file"));
  new_options.add(make_option("search_allowed_transitions", search_allowed_transitions)
                      .help("read file of allowed transitions [def: all transitions are allowed]"));
  new_options.add(make_option("search_subsample_time", priv.subsample_timesteps)
                      .help("instead of training at all timesteps, use a subset. if value in (0,1), train on a random "
                            "v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"));
  new_options.add(
      make_option("search_neighbor_features", neighbor_features_string)
          .keep()
          .help("copy features from neighboring lines. argument looks like: '-1:a,+2' meaning copy previous line "
                "namespace a and next next line from namespace _unnamed_, where ',' separates them"));
  new_options.add(make_option("search_rollout_num_steps", priv.rollout_num_steps)
                      .help("how many calls of \"loss\" before we stop really predicting on rollouts and switch to "
                            "oracle (default means \"infinite\")"));
  new_options.add(make_option("search_history_length", priv.history_length)
                      .keep()
                      .default_value(1)
                      .help("some tasks allow you to specify how much history their depend on; specify that here"));
  new_options.add(make_option("search_no_caching", priv.no_caching)
                      .help("turn off the built-in caching ability (makes things slower, but technically more safe)"));
  new_options.add(
      make_option("search_xv", priv.xv).help("train two separate policies, alternating prediction/learning"));
  new_options.add(make_option("search_perturb_oracle", priv.perturb_oracle)
                      .default_value(0.f)
                      .help("perturb the oracle on rollin with this probability"));
  new_options.add(make_option("search_linear_ordering", priv.linear_ordering)
                      .help("insist on generating examples in linear order (def: hoopla permutation)"));
  new_options.add(make_option("search_active_verify", priv.active_csoaa_verify)
                      .help("verify that active learning is doing the right thing (arg = multiplier, should be = "
                            "cost_range * range_c)"));
  new_options.add(make_option("search_save_every_k_runs", priv.save_every_k_runs).help("save model every k runs"));
  options.add_and_parse(new_options);

  // If hook was passed as the search_task then do not activate reduction. This task can only be used in library form.
  if (!options.was_supplied("search_task") || task_string == "hook")
    return nullptr;

  search_initialize(&all, *sch.get());

  parse_neighbor_features(neighbor_features_string, *sch.get());

  if (interpolation_string.compare("data") == 0)  // run as dagger
  {
    priv.adaptive_beta = true;
    priv.allow_current_policy = true;
    priv.passes_per_policy = all.numpasses;
    if (priv.current_policy > 1)
      priv.current_policy = 1;
  }
  else if (interpolation_string.compare("policy") == 0)
    ;
  else
    THROW("error: --search_interpolation must be 'data' or 'policy'");

  if ((rollout_string.compare("policy") == 0) || (rollout_string.compare("learn") == 0))
    priv.rollout_method = POLICY;
  else if ((rollout_string.compare("oracle") == 0) || (rollout_string.compare("ref") == 0))
    priv.rollout_method = ORACLE;
  else if ((rollout_string.compare("mix_per_state") == 0))
    priv.rollout_method = MIX_PER_STATE;
  else if ((rollout_string.compare("mix_per_roll") == 0) || (rollout_string.compare("mix") == 0))
    priv.rollout_method = MIX_PER_ROLL;
  else if ((rollout_string.compare("none") == 0))
  {
    priv.rollout_method = NO_ROLLOUT;
    priv.no_caching = true;
  }
  else
    THROW("error: --search_rollout must be 'learn', 'ref', 'mix', 'mix_per_state' or 'none'");

  if ((rollin_string.compare("policy") == 0) || (rollin_string.compare("learn") == 0))
    priv.rollin_method = POLICY;
  else if ((rollin_string.compare("oracle") == 0) || (rollin_string.compare("ref") == 0))
    priv.rollin_method = ORACLE;
  else if ((rollin_string.compare("mix_per_state") == 0))
    priv.rollin_method = MIX_PER_STATE;
  else if ((rollin_string.compare("mix_per_roll") == 0) || (rollin_string.compare("mix") == 0))
    priv.rollin_method = MIX_PER_ROLL;
  else
    THROW("error: --search_rollin must be 'learn', 'ref', 'mix' or 'mix_per_state'");

  // check if the base learner is contextual bandit, in which case, we dont rollout all actions.
  priv.allowed_actions_cache = &calloc_or_throw<polylabel>();
  if (options.was_supplied("cb"))
  {
    priv.cb_learner = true;
    CB::cb_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cb.costs = v_init<CB::cb_class>();
    priv.gte_label.cb.costs = v_init<CB::cb_class>();
  }
  else
  {
    priv.cb_learner = false;
    CS::cs_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cs.costs = v_init<CS::wclass>();
    priv.gte_label.cs.costs = v_init<CS::wclass>();
  }

  ensure_param(priv.beta, 0.0, 1.0, 0.5, "warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(priv.alpha, 0.0, 1.0, 1e-10f, "warning: search_alpha must be in (0,1); resetting to 1e-10");

  priv.num_calls_to_run = 0;

  // compute total number of policies we will have at end of training
  // we add current_policy for cases where we start from an initial set of policies loaded through -i option
  uint32_t tmp_number_of_policies = priv.current_policy;
  if (all.training)
    tmp_number_of_policies += (int)ceil(((float)all.numpasses) / ((float)priv.passes_per_policy));

  // the user might have specified the number of policies that will eventually be trained through multiple vw calls,
  // so only set total_number_of_policies to computed value if it is larger
  cdbg << "current_policy=" << priv.current_policy << " tmp_number_of_policies=" << tmp_number_of_policies
       << " total_number_of_policies=" << priv.total_number_of_policies << endl;
  if (tmp_number_of_policies > priv.total_number_of_policies)
  {
    priv.total_number_of_policies = tmp_number_of_policies;
    if (priv.current_policy >
        0)  // we loaded a file but total number of policies didn't match what is needed for training
      std::cerr << "warning: you're attempting to train more classifiers than was allocated initially. Likely to cause "
                   "bad performance."
                << endl;
  }

  // current policy currently points to a new policy we would train
  // if we are not training and loaded a bunch of policies for testing, we need to subtract 1 from current policy
  // so that we only use those loaded when testing (as run_prediction is called with allow_current to true)
  if (!all.training && priv.current_policy > 0)
    priv.current_policy--;

  all.options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
  all.options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);

  all.options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
  all.options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);

  cdbg << "search current_policy = " << priv.current_policy
       << " total_number_of_policies = " << priv.total_number_of_policies << endl;

  if (task_string.compare("list") == 0)
  {
    std::cerr << endl << "available search tasks:" << endl;
    for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->task_name << endl;
    std::cerr << endl;
    exit(0);
  }
  if (metatask_string.compare("list") == 0)
  {
    std::cerr << endl << "available search metatasks:" << endl;
    for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->metatask_name << endl;
    std::cerr << endl;
    exit(0);
  }
  for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
    if (task_string.compare((*mytask)->task_name) == 0)
    {
      priv.task = *mytask;
      sch->task_name = (*mytask)->task_name;
      break;
    }
  if (priv.task == nullptr)
  {
    if (!options.was_supplied("help"))
      THROW("fail: unknown task for --search_task '" << task_string << "'; use --search_task list to get a list");
  }
  priv.metatask = nullptr;
  for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
    if (metatask_string.compare((*mytask)->metatask_name) == 0)
    {
      priv.metatask = *mytask;
      sch->metatask_name = (*mytask)->metatask_name;
      break;
    }
  all.p->emptylines_separate_examples = true;

  if (!options.was_supplied("csoaa") && !options.was_supplied("cs_active") && !options.was_supplied("csoaa_ldf") &&
      !options.was_supplied("wap_ldf") && !options.was_supplied("cb"))
  {
    options.insert("csoaa", std::to_string(priv.A));
  }

  priv.active_csoaa = options.was_supplied("cs_active");
  priv.active_csoaa_verify = -1.;
  if (options.was_supplied("search_active_verify"))
    if (!priv.active_csoaa)
      THROW("cannot use --search_active_verify without using --cs_active");

  cdbg << "active_csoaa = " << priv.active_csoaa << ", active_csoaa_verify = " << priv.active_csoaa_verify << endl;

  base_learner* base = setup_base(*all.options, all);

  // default to OAA labels unless the task wants to override this (which they can do in initialize)
  all.p->lp = MC::mc_label;
  all.label_type = label_type::mc;
  if (priv.task && priv.task->initialize)
    priv.task->initialize(*sch.get(), priv.A, options);
  if (priv.metatask && priv.metatask->initialize)
    priv.metatask->initialize(*sch.get(), priv.A, options);
  priv.meta_t = 0;

  if (options.was_supplied("search_allowed_transitions"))
    read_allowed_transitions((action)priv.A, search_allowed_transitions.c_str());

  // set up auto-history (used to only do this if AUTO_CONDITION_FEATURES was on, but that doesn't work for hooktask)
  handle_condition_options(all, priv.acset);

  if (!priv.allow_current_policy)  // if we're not dagger
    all.check_holdout_every_n_passes = priv.passes_per_policy;

  all.searchstr = &sch;

  priv.start_clock_time = clock();

  if (priv.xv)
    priv.num_learners *= 3;

  cdbg << "num_learners = " << priv.num_learners << endl;

  learner<search, multi_ex>& l = init_learner(sch, make_base(*base), do_actual_learning<true>,
      do_actual_learning<false>, priv.total_number_of_policies * priv.num_learners);
  l.set_finish_example(finish_multiline_example);
  l.set_end_examples(end_examples);
  l.set_finish(search_finish);
  l.set_end_pass(end_pass);
  return make_base(l);
}